

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O0

int __thiscall UdpLayer::status(UdpLayer *this,ostream *out)

{
  ostream *poVar1;
  void *this_00;
  ostream *out_local;
  UdpLayer *this_local;
  
  poVar1 = std::operator<<(out,"UdpLayer::status()");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(out,"localaddr: ");
  poVar1 = ::operator<<(poVar1,&this->laddr);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(out,"sockfd: ");
  this_00 = (void *)std::ostream::operator<<(poVar1,this->sockfd);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  return 1;
}

Assistant:

int UdpLayer::status(std::ostream &out) {
	out << "UdpLayer::status()" << std::endl;
	out << "localaddr: " << laddr << std::endl;
	out << "sockfd: " << sockfd << std::endl;
	out << std::endl;
	return 1;
}